

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O0

image * load_png_image_from_file(FILE *fp)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  __jmp_buf_tag *__env;
  rgba local_c8;
  ulong local_b8;
  size_t j_1;
  float local_a8;
  real_t local_a4;
  ulong local_a0;
  size_t j;
  long lStack_90;
  real_t scale;
  png_byte *row;
  size_t i_1;
  size_t i;
  size_t stride;
  size_t channel_count;
  uint local_60;
  uint uStack_5c;
  _Bool has_alpha;
  png_uint_32 bit_depth;
  png_uint_32 color_type;
  size_t height;
  size_t width;
  png_byte *row_bytes;
  png_byte **row_ptrs;
  image *image;
  png_infop info_ptr;
  png_structp png_ptr;
  char sig [8];
  FILE *fp_local;
  
  sig = (char  [8])fp;
  fread(&png_ptr,1,8,(FILE *)fp);
  iVar2 = png_sig_cmp(&png_ptr,0,8);
  if (iVar2 == 0) {
    info_ptr = (png_infop)png_create_read_struct("1.6.37",0,0);
    if (info_ptr == (png_infop)0x0) {
      fp_local = (FILE *)0x0;
    }
    else {
      image = (image *)png_create_info_struct(info_ptr);
      if (image == (image *)0x0) {
        png_destroy_read_struct(&info_ptr,0);
        fp_local = (FILE *)0x0;
      }
      else {
        row_ptrs = (png_byte **)0x0;
        row_bytes = (png_byte *)0x0;
        width = 0;
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(info_ptr,longjmp,200);
        iVar2 = _setjmp(__env);
        if (iVar2 == 0) {
          png_set_sig_bytes(info_ptr,8);
          png_init_io(info_ptr,sig);
          png_read_info(info_ptr,image);
          uVar3 = png_get_image_width(info_ptr,image);
          height = (size_t)uVar3;
          uVar3 = png_get_image_height(info_ptr,image);
          _bit_depth = (png_byte *)(ulong)uVar3;
          bVar1 = png_get_color_type(info_ptr,image);
          uStack_5c = (uint)bVar1;
          bVar1 = png_get_bit_depth(info_ptr,image);
          local_60 = (uint)bVar1;
          if (uStack_5c == 3) {
            png_set_palette_to_rgb(info_ptr);
          }
          else if ((uStack_5c == 0) || (uStack_5c == 4)) {
            png_set_gray_to_rgb(info_ptr);
          }
          if (local_60 == 0x10) {
            png_set_strip_16(info_ptr);
          }
          channel_count._7_1_ = (uStack_5c & 4) != 0;
          iVar2 = png_get_valid(info_ptr,image,0x10);
          if (iVar2 != 0) {
            png_set_tRNS_to_alpha(info_ptr);
            channel_count._7_1_ = 1;
          }
          iVar2 = 3;
          if ((channel_count._7_1_ & 1) != 0) {
            iVar2 = 4;
          }
          stride = (size_t)iVar2;
          i = height * stride;
          row_bytes = (png_byte *)xmalloc((long)_bit_depth << 3);
          width = (size_t)xmalloc(i * (long)_bit_depth);
          for (i_1 = 0; i_1 < _bit_depth; i_1 = i_1 + 1) {
            *(void **)(row_bytes + i_1 * 8) = (void *)(width + i * i_1);
          }
          png_read_image(info_ptr,row_bytes);
          row_ptrs = (png_byte **)new_image(height,(size_t)_bit_depth,stride);
          for (row = (png_byte *)0x0; row < _bit_depth; row = row + 1) {
            lStack_90 = width + i * (long)row;
            j._4_4_ = 0x3b808081;
            if ((channel_count._7_1_ & 1) == 0) {
              for (local_b8 = 0; local_b8 < height; local_b8 = local_b8 + 1) {
                local_c8.r = (float)*(byte *)(lStack_90 + local_b8 * 4) * 0.003921569;
                local_c8.g = (float)*(byte *)(lStack_90 + 1 + local_b8 * 4) * 0.003921569;
                local_c8.b = (float)*(byte *)(lStack_90 + 2 + local_b8 * 4) * 0.003921569;
                local_c8.a = (float)*(byte *)(lStack_90 + 3 + local_b8 * 4) * 0.003921569;
                set_rgba_pixel((image *)row_ptrs,local_b8,(size_t)row,&local_c8);
              }
            }
            else {
              for (local_a0 = 0; local_a0 < height; local_a0 = local_a0 + 1) {
                j_1._0_4_ = (float)*(byte *)(lStack_90 + local_a0 * 3) * 0.003921569;
                j_1._4_4_ = (float)*(byte *)(lStack_90 + 1 + local_a0 * 3) * 0.003921569;
                local_a8 = (float)*(byte *)(lStack_90 + 2 + local_a0 * 3) * 0.003921569;
                local_a4 = 0.0;
                set_rgba_pixel((image *)row_ptrs,local_a0,(size_t)row,(rgba *)&j_1);
              }
            }
          }
          free(row_bytes);
          free((void *)width);
          row_bytes = (png_byte *)0x0;
          width = 0;
          png_destroy_read_struct(&info_ptr,&image,0);
          fp_local = (FILE *)row_ptrs;
        }
        else {
          if (row_ptrs != (png_byte **)0x0) {
            free_image((image *)row_ptrs);
          }
          if (row_bytes != (png_byte *)0x0) {
            free(row_bytes);
          }
          if (width != 0) {
            free((void *)width);
          }
          png_destroy_read_struct(&info_ptr,&image,0);
          fp_local = (FILE *)0x0;
        }
      }
    }
  }
  else {
    fp_local = (FILE *)0x0;
  }
  return (image *)fp_local;
}

Assistant:

static struct image* load_png_image_from_file(FILE* fp) {
    char sig[8];
    fread(sig, 1, 8, fp);
    if (!png_check_sig((unsigned char*)sig, 8))
        return NULL;

    png_structp png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return NULL;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return NULL;
    }

    struct image* image = NULL;
    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (image)     free_image(image);
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
        return NULL;
    }

    png_set_sig_bytes(png_ptr, 8);
    png_init_io(png_ptr, fp);
    png_read_info(png_ptr, info_ptr);

    size_t width  = png_get_image_width(png_ptr, info_ptr);
    size_t height = png_get_image_height(png_ptr, info_ptr);

    png_uint_32 color_type = png_get_color_type(png_ptr, info_ptr);
    png_uint_32 bit_depth  = png_get_bit_depth(png_ptr, info_ptr);

    // Expand paletted and grayscale images to RGB
    if (color_type == PNG_COLOR_TYPE_PALETTE)
        png_set_palette_to_rgb(png_ptr);
    else if (
        color_type == PNG_COLOR_TYPE_GRAY ||
        color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
        png_set_gray_to_rgb(png_ptr);

    // Transform to 8 bit per channel
    if (bit_depth == 16)
        png_set_strip_16(png_ptr);

    // Get alpha channel when there is one
    bool has_alpha = color_type & PNG_COLOR_MASK_ALPHA;
    if (png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
        png_set_tRNS_to_alpha(png_ptr);
        has_alpha = true;
    }

    size_t channel_count = has_alpha ? 4 : 3;
    size_t stride = width * channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * height);
    for (size_t i = 0; i < height; ++i)
        row_ptrs[i] = row_bytes + stride * i;
    png_read_image(png_ptr, row_ptrs);

    // Transform the byte data into a floating point image
    image = new_image(width, height, channel_count);
    for (size_t i = 0; i < height; ++i) {
        const png_byte* row = row_bytes + stride * i;
        const real_t scale = (real_t)1 / (real_t)255;
        if (has_alpha) {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 3 + 0] * scale,
                    .g = (real_t)row[j * 3 + 1] * scale,
                    .b = (real_t)row[j * 3 + 2] * scale,
                });
            }
        } else {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 4 + 0] * scale,
                    .g = (real_t)row[j * 4 + 1] * scale,
                    .b = (real_t)row[j * 4 + 2] * scale,
                    .a = (real_t)row[j * 4 + 3] * scale
                });
            }
        }
    }
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
    return image;
}